

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAnalogEvent.cpp
# Opt level: O0

VRDataIndex * MinVR::VRAnalogEvent::createValidDataIndex(string *eventName,float analogValue)

{
  string *in_RSI;
  VRDataIndex *in_RDI;
  string *in_stack_00000018;
  VRDataIndex *in_stack_00000020;
  VRDataIndex *di;
  allocator<char> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  VRFloat in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  VRDataIndex *in_stack_ffffffffffffff28;
  VRString *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  VRDataIndex *in_stack_ffffffffffffff48;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  string local_68 [48];
  string local_38 [35];
  undefined1 local_15;
  
  local_15 = 0;
  std::__cxx11::string::string(local_38,in_RSI);
  VRDataIndex::VRDataIndex(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  VRDataIndex::addData
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  VRDataIndex::addData
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
  return in_RDI;
}

Assistant:

VRDataIndex VRAnalogEvent::createValidDataIndex(const std::string &eventName, float analogValue) {
    VRDataIndex di(eventName);
    di.addData("EventType", "AnalogUpdate");
    di.addData("AnalogValue", analogValue);
    return di;
}